

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalIntergerBinaryExpression
          (Evaluator *this,Token *op,GCPtr<symbols::Object> *leftExpr,
          GCPtr<symbols::Object> *rightExpr)

{
  Object *pOVar1;
  IntObject *pIVar2;
  long local_110;
  long local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  long local_38;
  long rightValue;
  long leftValue;
  GCPtr<symbols::Object> *rightExpr_local;
  GCPtr<symbols::Object> *leftExpr_local;
  Token *op_local;
  
  leftValue = (long)rightExpr;
  rightExpr_local = leftExpr;
  leftExpr_local = (GCPtr<symbols::Object> *)op;
  op_local = (Token *)this;
  pOVar1 = GCPtr<symbols::Object>::raw(leftExpr);
  if (pOVar1 == (Object *)0x0) {
    local_100 = 0;
  }
  else {
    local_100 = __dynamic_cast(pOVar1,&symbols::Object::typeinfo,&symbols::IntObject::typeinfo,0);
  }
  rightValue = *(long *)(local_100 + 0x10);
  pOVar1 = GCPtr<symbols::Object>::raw((GCPtr<symbols::Object> *)leftValue);
  if (pOVar1 == (Object *)0x0) {
    local_110 = 0;
  }
  else {
    local_110 = __dynamic_cast(pOVar1,&symbols::Object::typeinfo,&symbols::IntObject::typeinfo,0);
  }
  local_38 = *(long *)(local_110 + 0x10);
  switch(*(undefined4 *)&leftExpr_local[1].addr) {
  case 0x104:
    nativeBooleanObject(this,rightValue == local_38);
    break;
  case 0x105:
    nativeBooleanObject(this,rightValue != local_38);
    break;
  case 0x106:
    nativeBooleanObject(this,local_38 < rightValue);
    break;
  case 0x107:
    nativeBooleanObject(this,rightValue < local_38);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Unknown Operator: ",&local_b9);
    std::__cxx11::string::string
              ((string *)&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (leftExpr_local + 2));
    newError(this,&local_b8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    break;
  case 0x10a:
    pIVar2 = (IntObject *)operator_new(0x18);
    symbols::IntObject::IntObject(pIVar2,(int)rightValue + (int)local_38);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)pIVar2);
    break;
  case 0x10b:
    pIVar2 = (IntObject *)operator_new(0x18);
    symbols::IntObject::IntObject(pIVar2,(int)rightValue - (int)local_38);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)pIVar2);
    break;
  case 0x10d:
    pIVar2 = (IntObject *)operator_new(0x18);
    symbols::IntObject::IntObject(pIVar2,(int)rightValue * (int)local_38);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)pIVar2);
    break;
  case 0x10e:
    if (local_38 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"ZeroDivisionError: ",&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"division by zero",&local_91);
      newError(this,&local_68,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else {
      pIVar2 = (IntObject *)operator_new(0x18);
      symbols::IntObject::IntObject(pIVar2,(int)(rightValue / local_38));
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)pIVar2);
    }
    break;
  case 0x123:
    nativeBooleanObject(this,rightValue <= local_38);
    break;
  case 0x125:
    nativeBooleanObject(this,local_38 <= rightValue);
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalIntergerBinaryExpression(Token& op, GCPtr<Object>& leftExpr, GCPtr<Object>& rightExpr){
    auto leftValue = dynamic_cast<IntObject*>(leftExpr.raw())->value;
    auto rightValue = dynamic_cast<IntObject*>(rightExpr.raw())->value;
    switch (op.Type) {
     case TokenType::PLUS:
        return new IntObject(leftValue + rightValue);
     case TokenType::MINUS:
        return new IntObject(leftValue - rightValue);
     case TokenType::ASTERISK:
        return new IntObject(leftValue * rightValue);
     case TokenType::DIV:
        {
            if(rightValue == 0)
               return newError("ZeroDivisionError: ",  "division by zero");
            return new IntObject(leftValue / rightValue);
        }
     case TokenType::EQ:
        return nativeBooleanObject(leftValue == rightValue);
     case TokenType::NOT_EQ:
        return nativeBooleanObject(leftValue != rightValue);
     case TokenType::LT:
        return nativeBooleanObject(leftValue < rightValue);
     case TokenType::GT:
        return nativeBooleanObject(leftValue > rightValue);
     case TokenType::LT_EQ:
        return nativeBooleanObject(leftValue <= rightValue);
     case TokenType::GT_EQ:
        return nativeBooleanObject(leftValue >= rightValue);
     default:
        return newError("Unknown Operator: ", op.Literal);
    }
}